

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

bool __thiscall QThreadPoolPrivate::tryStart(QThreadPoolPrivate *this,QRunnable *task)

{
  Data *pDVar1;
  bool bVar2;
  value_type pQVar3;
  
  pDVar1 = (this->allThreads).q_hash.d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    bVar2 = areAllThreadsActive(this);
    if (bVar2) {
      return false;
    }
    if ((this->waitingThreads).super_QList<QThreadPoolThread_*>.d.size != 0) {
      enqueueTask(this,task,0);
      pQVar3 = QList<QThreadPoolThread_*>::takeFirst
                         (&(this->waitingThreads).super_QList<QThreadPoolThread_*>);
      QWaitCondition::wakeOne(&pQVar3->runnableReady);
      return true;
    }
    if ((this->expiredThreads).super_QList<QThreadPoolThread_*>.d.size != 0) {
      pQVar3 = QList<QThreadPoolThread_*>::takeFirst
                         (&(this->expiredThreads).super_QList<QThreadPoolThread_*>);
      this->activeThreads = this->activeThreads + 1;
      pQVar3->runnable = task;
      QThread::wait(&pQVar3->super_QThread,(void *)0x7fffffffffffffff);
      QThread::start(&pQVar3->super_QThread,this->threadPriority);
      return true;
    }
  }
  startThread(this,task);
  return true;
}

Assistant:

bool QThreadPoolPrivate::tryStart(QRunnable *task)
{
    Q_ASSERT(task != nullptr);
    if (allThreads.isEmpty()) {
        // always create at least one thread
        startThread(task);
        return true;
    }

    // can't do anything if we're over the limit
    if (areAllThreadsActive())
        return false;

    if (!waitingThreads.isEmpty()) {
        // recycle an available thread
        enqueueTask(task);
        waitingThreads.takeFirst()->runnableReady.wakeOne();
        return true;
    }

    if (!expiredThreads.isEmpty()) {
        // restart an expired thread
        QThreadPoolThread *thread = expiredThreads.dequeue();
        Q_ASSERT(thread->runnable == nullptr);

        ++activeThreads;

        thread->runnable = task;

        // Ensure that the thread has actually finished, otherwise the following
        // start() has no effect.
        thread->wait();
        Q_ASSERT(thread->isFinished());
        thread->start(threadPriority);
        return true;
    }

    // start a new thread
    startThread(task);
    return true;
}